

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O2

tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
camp::tuple_cat_pair<camp::tuple<int,char>&,camp::tuple<float,std::__cxx11::string>&,0l,1l,0l,1l>
          (tuple_helper<camp::int_seq<long,0l,1l,2l,3l>,camp::list<int,char,float,std::__cxx11::string>>
           *__return_storage_ptr__,camp *this,float *l)

{
  internal::
  tuple_helper<camp::int_seq<long,0l,1l,2l,3l>,camp::list<int,char,float,std::__cxx11::string>>::
  tuple_helper<int&,char&,float&,std::__cxx11::string&>
            (__return_storage_ptr__,(int *)this,(char *)(this + 4),l,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(l + 2));
  return (tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)__return_storage_ptr__;
}

Assistant:

CAMP_HOST_DEVICE constexpr auto tuple_cat_pair(L&& l,
                                               camp::idx_seq<Lidx...>,
                                               R&& r,
                                               camp::idx_seq<Ridx...>) noexcept
{
  return ::camp::tuple<camp::at_v<typename std::decay_t<L>::TList, Lidx>...,
                       camp::at_v<typename std::decay_t<R>::TList, Ridx>...>(
      ::camp::get<Lidx>(std::forward<L>(l))...,
      ::camp::get<Ridx>(std::forward<R>(r))...);
}